

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ConstantValue::convertToByteArray
          (ConstantValue *__return_storage_ptr__,ConstantValue *this,bitwidth_t size,bool isSigned)

{
  bool bVar1;
  string *psVar2;
  reference pcVar3;
  size_type sVar4;
  SVInt local_f8;
  SVInt local_e8;
  char local_d1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_d0;
  char ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  Elements array;
  ConstantValue local_98;
  string local_70;
  string local_40 [8];
  string result;
  bool isSigned_local;
  bitwidth_t size_local;
  ConstantValue *this_local;
  
  result.field_2._M_local_buf[0xb] = isSigned;
  result.field_2._12_4_ = size;
  bVar1 = isUnpacked(this);
  if (bVar1) {
    ConstantValue(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string(local_40);
  bVar1 = isInteger(this);
  if (bVar1) {
    convertToStr(&local_98,this);
    str_abi_cxx11_(&local_70,&local_98);
    std::__cxx11::string::operator=(local_40,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    ~ConstantValue(&local_98);
  }
  else {
    bVar1 = isString(this);
    if (!bVar1) {
      ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
      array.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      goto LAB_001faebd;
    }
    psVar2 = str_abi_cxx11_(this);
    std::__cxx11::string::operator=(local_40,(string *)psVar2);
  }
  if (result.field_2._12_4_ == 0) {
    result.field_2._12_4_ = std::__cxx11::string::size();
  }
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&__range1);
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&__range1,
             (ulong)(uint)result.field_2._12_4_);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_d0._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff30), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_d1 = *pcVar3;
    sVar4 = std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                      ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       &__range1);
    if ((uint)result.field_2._12_4_ <= sVar4) break;
    SVInt::SVInt(&local_e8,8,(long)local_d1,(bool)(result.field_2._M_local_buf[0xb] & 1));
    std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
    emplace_back<slang::SVInt>
              ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&__range1,
               &local_e8);
    SVInt::~SVInt(&local_e8);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  while (sVar4 = std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                           ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                            &__range1), sVar4 < (uint)result.field_2._12_4_) {
    SVInt::SVInt(&local_f8,8,0,(bool)(result.field_2._M_local_buf[0xb] & 1));
    std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
    emplace_back<slang::SVInt>
              ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&__range1,
               &local_f8);
    SVInt::~SVInt(&local_f8);
  }
  ConstantValue(__return_storage_ptr__,(Elements *)&__range1);
  array.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&__range1);
LAB_001faebd:
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ConstantValue::convertToByteArray(bitwidth_t size, bool isSigned) const {
    if (isUnpacked())
        return *this;

    std::string result;
    if (isInteger())
        result = convertToStr().str();
    else if (isString())
        result = str();
    else
        return nullptr;

    if (!size) // dynamic array use string size
        size = static_cast<bitwidth_t>(result.size());

    Elements array;
    array.reserve(size);

    for (auto ch : result) {
        if (array.size() >= size)
            break;
        array.emplace_back(SVInt(8, static_cast<uint64_t>(ch), isSigned));
    }

    while (array.size() < size)
        array.emplace_back(SVInt(8, 0, isSigned));
    return array;
}